

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorK<4>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  AccelData *pAVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  long lVar16;
  undefined1 auVar17 [16];
  ulong uVar18;
  byte bVar19;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  Primitive_conflict4 *prim;
  ulong uVar24;
  byte bVar25;
  byte bVar26;
  ulong uVar27;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar28;
  bool bVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  vint4 bi;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  vint4 ai;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined4 uVar76;
  vint4 bi_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  vint4 bi_4;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  vint4 ai_4;
  undefined1 in_ZMM6 [64];
  vint4 bi_3;
  undefined1 in_ZMM7 [64];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar82 [64];
  int in_XMM17_Da;
  int in_XMM17_Db;
  int in_XMM17_Dc;
  int in_XMM17_Dd;
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  vbool<4>_conflict valid0;
  InstanceArrayIntersectorK<4> local_118e;
  Precalculations pre;
  uint local_118c;
  ulong local_1170;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  uint local_1008 [4];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar53 [16];
  
  auVar41 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  uVar31 = vpcmpeqd_avx512vl(auVar41,(undefined1  [16])valid_i->field_0);
  uVar31 = uVar31 & 0xf;
  bVar26 = (byte)uVar31;
  if (bVar26 == 0) {
    return;
  }
  pAVar9 = This->ptr;
  auVar6 = *(undefined1 (*) [16])ray;
  auVar7 = *(undefined1 (*) [16])(ray + 0x10);
  auVar8 = *(undefined1 (*) [16])(ray + 0x20);
  auVar39 = *(undefined1 (*) [16])(ray + 0x40);
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  auVar33 = vandps_avx(auVar39,auVar37);
  auVar59._8_4_ = 0x219392ef;
  auVar59._0_8_ = 0x219392ef219392ef;
  auVar59._12_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar33,auVar59,1);
  auVar33 = vblendmps_avx512vl(auVar39,auVar59);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar36._0_4_ = (uint)bVar29 * auVar33._0_4_ | (uint)!bVar29 * in_XMM17_Da;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar29 * auVar33._4_4_ | (uint)!bVar29 * in_XMM17_Db;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar29 * auVar33._8_4_ | (uint)!bVar29 * in_XMM17_Dc;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar29 * auVar33._12_4_ | (uint)!bVar29 * in_XMM17_Dd;
  auVar33 = *(undefined1 (*) [16])(ray + 0x50);
  auVar34 = vandps_avx512vl(auVar33,auVar37);
  uVar32 = vcmpps_avx512vl(auVar34,auVar59,1);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar34._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._8_4_;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._12_4_;
  auVar33 = *(undefined1 (*) [16])(ray + 0x60);
  auVar35 = vandps_avx512vl(auVar33,auVar37);
  uVar32 = vcmpps_avx512vl(auVar35,auVar59,1);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar35._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._8_4_;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._12_4_;
  auVar33 = vrcp14ps_avx512vl(auVar36);
  auVar40 = ZEXT816(0) << 0x20;
  auVar81 = ZEXT864(0) << 0x20;
  auVar38._8_4_ = 0x3f800000;
  auVar38._0_8_ = &DAT_3f8000003f800000;
  auVar38._12_4_ = 0x3f800000;
  auVar78 = ZEXT1664(auVar38);
  auVar36 = vfnmadd213ps_avx512vl(auVar36,auVar33,auVar38);
  auVar36 = vfmadd132ps_avx512vl(auVar36,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar34);
  auVar34 = vfnmadd213ps_avx512vl(auVar34,auVar33,auVar38);
  auVar34 = vfmadd132ps_avx512vl(auVar34,auVar33,auVar33);
  auVar33 = vrcp14ps_avx512vl(auVar35);
  auVar35 = vfnmadd213ps_avx512vl(auVar35,auVar33,auVar38);
  auVar35 = vfmadd132ps_avx512vl(auVar35,auVar33,auVar33);
  auVar37 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar40);
  auVar38 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar40);
  uVar27 = uVar31 ^ 0xf;
  auVar39 = vcmpps_avx(auVar39,auVar40,1);
  auVar69 = ZEXT1664(auVar39);
  auVar33._8_4_ = 1;
  auVar33._0_8_ = 0x100000001;
  auVar33._12_4_ = 1;
  auVar33 = vandps_avx512vl(auVar39,auVar33);
  uVar32 = vcmpps_avx512vl(auVar40,*(undefined1 (*) [16])(ray + 0x50),0xe);
  auVar53._8_4_ = 2;
  auVar53._0_8_ = 0x200000002;
  auVar53._12_4_ = 2;
  auVar75 = ZEXT1664(auVar53);
  auVar39 = vpsubd_avx512vl(auVar53,auVar39);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar42._0_4_ = (uint)bVar29 * auVar39._0_4_ | (uint)!bVar29 * auVar33._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * auVar33._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar29 * auVar39._8_4_ | (uint)!bVar29 * auVar33._8_4_;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar29 * auVar39._12_4_ | (uint)!bVar29 * auVar33._12_4_;
  uVar32 = vcmpps_avx512vl(auVar40,*(undefined1 (*) [16])(ray + 0x60),0xe);
  auVar39._8_4_ = 4;
  auVar39._0_8_ = 0x400000004;
  auVar39._12_4_ = 4;
  auVar39 = vpord_avx512vl(auVar42,auVar39);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar40._0_4_ = (uint)bVar29 * auVar39._0_4_ | !bVar29 * auVar42._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar29 * auVar39._4_4_ | !bVar29 * auVar42._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar29 * auVar39._8_4_ | !bVar29 * auVar42._8_4_;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar29 * auVar39._12_4_ | !bVar29 * auVar42._12_4_;
  auVar72 = ZEXT1664(auVar40);
  auVar39 = vmovdqa32_avx512vl(auVar40);
  bVar29 = (bool)((byte)(uVar31 >> 1) & 1);
  bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
  bVar13 = SUB81(uVar31 >> 3,0);
  local_1008[0] = (uint)(bVar26 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar41._0_4_;
  local_1008[1] = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * auVar41._4_4_;
  local_1008[2] = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar41._8_4_;
  local_1008[3] = (uint)bVar13 * auVar39._12_4_ | (uint)!bVar13 * auVar41._12_4_;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar83 = ZEXT1664(auVar41);
  auVar39 = vxorps_avx512vl(auVar6,auVar41);
  auVar39 = vmulps_avx512vl(auVar36,auVar39);
  auVar33 = vxorps_avx512vl(auVar7,auVar41);
  auVar33 = vmulps_avx512vl(auVar34,auVar33);
  auVar41 = vxorps_avx512vl(auVar8,auVar41);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar85 = ZEXT1664(auVar42);
  auVar41 = vmulps_avx512vl(auVar35,auVar41);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar84 = ZEXT1664(auVar42);
  vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
  auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
  auVar87 = ZEXT1664(auVar42);
LAB_007910e9:
  pSVar20 = stack + 1;
  lVar16 = 0;
  for (uVar32 = uVar31; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
    lVar16 = lVar16 + 1;
  }
  uVar5 = local_1008[lVar16];
  auVar63._4_4_ = uVar5;
  auVar63._0_4_ = uVar5;
  auVar63._8_4_ = uVar5;
  auVar63._12_4_ = uVar5;
  auVar60._4_4_ = local_1008[1];
  auVar60._0_4_ = local_1008[0];
  auVar60._8_4_ = local_1008[2];
  auVar60._12_4_ = local_1008[3];
  uVar32 = vpcmpeqd_avx512vl(auVar63,auVar60);
  uVar32 = uVar32 & 0xf;
  bVar19 = (byte)uVar32;
  stack[0].mask = CONCAT44((int)((ulong)lVar16 >> 0x20),(uint)bVar19);
  auVar53 = auVar85._0_16_;
  auVar42 = vblendmps_avx512vl(auVar53,auVar36);
  auVar56._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | !(bool)(bVar19 & 1) * uVar5;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar29 * auVar42._4_4_ | !bVar29 * uVar5;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar29 * auVar42._8_4_ | !bVar29 * uVar5;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar56._12_4_ = (uint)bVar29 * auVar42._12_4_ | !bVar29 * uVar5;
  auVar42 = vblendmps_avx512vl(auVar53,auVar34);
  auVar55._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar69._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * auVar69._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * auVar69._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar55._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * auVar69._12_4_;
  auVar42 = vblendmps_avx512vl(auVar53,auVar35);
  auVar57._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar72._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * auVar72._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * auVar72._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar57._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * auVar72._12_4_;
  auVar40 = auVar84._0_16_;
  auVar42 = vblendmps_avx512vl(auVar40,auVar36);
  auVar61._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar75._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * auVar75._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * auVar75._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar61._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * auVar75._12_4_;
  auVar42 = vblendmps_avx512vl(auVar40,auVar34);
  auVar43._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar78._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * auVar78._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * auVar78._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar43._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * auVar78._12_4_;
  auVar42 = vblendmps_avx512vl(auVar40,auVar35);
  auVar44._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar81._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * auVar81._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * auVar81._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar44._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * auVar81._12_4_;
  auVar42 = vblendmps_avx512vl(auVar53,auVar6);
  auVar45._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM6._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM6._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM6._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar45._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM6._12_4_;
  auVar42 = vblendmps_avx512vl(auVar53,auVar7);
  auVar46._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM7._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM7._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM7._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar46._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM7._12_4_;
  in_ZMM7 = ZEXT1664(auVar46);
  auVar42 = vblendmps_avx512vl(auVar53,auVar8);
  auVar47._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM8._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM8._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM8._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar47._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM8._12_4_;
  auVar42 = vblendmps_avx512vl(auVar40,auVar6);
  auVar48._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM9._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM9._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM9._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar48._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM9._12_4_;
  auVar42 = vblendmps_avx512vl(auVar40,auVar7);
  auVar49._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM10._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM10._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM10._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar49._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM10._12_4_;
  auVar42 = vblendmps_avx512vl(auVar40,auVar8);
  auVar50._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM11._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM11._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM11._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar50._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM11._12_4_;
  auVar42 = vblendmps_avx512vl(auVar40,auVar38);
  auVar51._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM30._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM30._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM30._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar51._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM30._12_4_;
  in_ZMM30 = ZEXT1664(auVar51);
  auVar42 = vblendmps_avx512vl(auVar53,auVar37);
  auVar52._0_4_ = (uint)(bVar19 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar19 & 1) * in_ZMM12._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar29 * auVar42._4_4_ | (uint)!bVar29 * in_ZMM12._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar29 * auVar42._8_4_ | (uint)!bVar29 * in_ZMM12._8_4_;
  bVar29 = SUB81(uVar32 >> 3,0);
  auVar52._12_4_ = (uint)bVar29 * auVar42._12_4_ | (uint)!bVar29 * in_ZMM12._12_4_;
  auVar42 = vpblendmd_avx512vl(auVar87._0_16_,auVar37);
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
  bVar13 = SUB81(uVar32 >> 3,0);
  in_ZMM31 = ZEXT1664(CONCAT412((uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * in_ZMM31._12_4_,
                                CONCAT48((uint)bVar10 * auVar42._8_4_ |
                                         (uint)!bVar10 * in_ZMM31._8_4_,
                                         CONCAT44((uint)bVar29 * auVar42._4_4_ |
                                                  (uint)!bVar29 * in_ZMM31._4_4_,
                                                  (uint)(bVar19 & 1) * auVar42._0_4_ |
                                                  (uint)!(bool)(bVar19 & 1) * in_ZMM31._0_4_))));
  local_118c = (uint)uVar32;
  uVar31 = ~stack[0].mask & uVar31;
  auVar42 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar42 = vminps_avx(auVar42,auVar56);
  auVar40 = vshufpd_avx(auVar42,auVar42,1);
  auVar42 = vminps_avx(auVar40,auVar42);
  auVar40 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar40 = vminps_avx(auVar40,auVar55);
  auVar53 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vminps_avx(auVar53,auVar40);
  auVar42 = vinsertps_avx(auVar42,auVar40,0x1c);
  auVar40 = vshufps_avx(auVar57,auVar57,0xb1);
  auVar40 = vminps_avx(auVar40,auVar57);
  auVar53 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vminps_avx(auVar53,auVar40);
  auVar42 = vinsertps_avx(auVar42,auVar40,0x20);
  auVar40 = vshufps_avx(auVar61,auVar61,0xb1);
  auVar40 = vmaxps_avx(auVar40,auVar61);
  auVar53 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vmaxps_avx(auVar53,auVar40);
  auVar53 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar53 = vmaxps_avx(auVar53,auVar43);
  auVar59 = vshufpd_avx(auVar53,auVar53,1);
  auVar53 = vmaxps_avx(auVar59,auVar53);
  auVar40 = vinsertps_avx(auVar40,auVar53,0x1c);
  auVar53 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar53 = vmaxps_avx(auVar53,auVar44);
  auVar59 = vshufpd_avx(auVar53,auVar53,1);
  auVar53 = vmaxps_avx(auVar59,auVar53);
  auVar40 = vinsertps_avx(auVar40,auVar53,0x20);
  uVar32 = vcmpps_avx512vl(auVar42,ZEXT816(0) << 0x20,5);
  auVar53 = vblendmps_avx512vl(auVar40,auVar42);
  bVar19 = (byte)uVar32;
  fVar1 = (float)((uint)(bVar19 & 1) * auVar53._0_4_);
  fVar2 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar53._4_4_);
  auVar54._4_4_ = fVar2;
  auVar54._0_4_ = fVar1;
  fVar3 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar53._8_4_);
  auVar54._8_4_ = fVar3;
  fVar4 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar53._12_4_);
  auVar54._12_4_ = fVar4;
  auVar53 = vmovshdup_avx(auVar54);
  vucomiss_avx512f(auVar53);
  auVar53 = vshufpd_avx(auVar54,auVar54,1);
  vucomiss_avx512f(auVar53);
  auVar53 = vucomiss_avx512f(auVar54);
  auVar86 = ZEXT1664(auVar53);
  auVar53 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar53 = vminps_avx(auVar53,auVar45);
  auVar59 = vshufpd_avx(auVar53,auVar53,1);
  auVar53 = vminps_avx(auVar59,auVar53);
  auVar59 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar59 = vminps_avx(auVar59,auVar46);
  auVar60 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vminps_avx(auVar60,auVar59);
  auVar53 = vinsertps_avx(auVar53,auVar59,0x1c);
  auVar59 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar59 = vminps_avx(auVar59,auVar47);
  auVar60 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vminps_avx(auVar60,auVar59);
  auVar53 = vinsertps_avx(auVar53,auVar59,0x20);
  auVar59 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar59 = vmaxps_avx(auVar59,auVar48);
  auVar60 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vmaxps_avx(auVar60,auVar59);
  auVar60 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar60 = vmaxps_avx(auVar60,auVar49);
  auVar56 = vshufpd_avx(auVar60,auVar60,1);
  auVar60 = vmaxps_avx(auVar56,auVar60);
  auVar59 = vinsertps_avx(auVar59,auVar60,0x1c);
  auVar60 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar60 = vmaxps_avx(auVar60,auVar50);
  auVar56 = vshufpd_avx(auVar60,auVar60,1);
  auVar60 = vmaxps_avx(auVar56,auVar60);
  auVar59 = vinsertps_avx(auVar59,auVar60,0x20);
  auVar55 = vblendmps_avx512vl(auVar59,auVar53);
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
  bVar14 = (bool)((byte)(uVar32 >> 3) & 1);
  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
  bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
  bVar15 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar56 = vshufps_avx512vl(auVar51,auVar51,0xb1);
  auVar57 = vmaxps_avx512vl(auVar56,auVar51);
  auVar78 = ZEXT1664(auVar57);
  auVar56 = vshufps_avx(auVar52,auVar52,0xb1);
  auVar56 = vminps_avx(auVar56,auVar52);
  in_ZMM6 = ZEXT1664(auVar56);
  auVar58._0_4_ =
       (float)((uint)(bVar19 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar42._0_4_);
  bVar13 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar58._4_4_ = (float)((uint)bVar13 * auVar40._4_4_ | (uint)!bVar13 * auVar42._4_4_);
  bVar13 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar58._8_4_ = (float)((uint)bVar13 * auVar40._8_4_ | (uint)!bVar13 * auVar42._8_4_);
  bVar13 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar58._12_4_ = (float)((uint)bVar13 * auVar40._12_4_ | (uint)!bVar13 * auVar42._12_4_);
  auVar70._0_4_ =
       (float)((uint)(bVar19 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar53._0_4_) *
       fVar1;
  auVar70._4_4_ = (float)((uint)bVar10 * auVar59._4_4_ | (uint)!bVar10 * auVar53._4_4_) * fVar2;
  auVar70._8_4_ = (float)((uint)bVar12 * auVar59._8_4_ | (uint)!bVar12 * auVar53._8_4_) * fVar3;
  auVar70._12_4_ = (float)((uint)bVar15 * auVar59._12_4_ | (uint)!bVar15 * auVar53._12_4_) * fVar4;
  auVar73._0_4_ =
       (float)((uint)(bVar19 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar60._0_4_) *
       auVar58._0_4_;
  auVar73._4_4_ =
       (float)((uint)bVar29 * auVar55._4_4_ | (uint)!bVar29 * auVar60._4_4_) * auVar58._4_4_;
  auVar73._8_4_ =
       (float)((uint)bVar11 * auVar55._8_4_ | (uint)!bVar11 * auVar60._8_4_) * auVar58._8_4_;
  auVar73._12_4_ =
       (float)((uint)bVar14 * auVar55._12_4_ | (uint)!bVar14 * auVar60._12_4_) * auVar58._12_4_;
  auVar75 = ZEXT1664(auVar73);
  stack[0].ptr.ptr = *(size_t *)&pAVar9[1].bounds.bounds0.lower.field_0;
  in_ZMM8 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  auVar79._4_4_ = auVar70._0_4_;
  auVar79._0_4_ = auVar70._0_4_;
  auVar79._8_4_ = auVar70._0_4_;
  auVar79._12_4_ = auVar70._0_4_;
  auVar40 = auVar83._0_16_;
  auVar42 = vxorps_avx512vl(auVar79,auVar40);
  in_ZMM9 = ZEXT1664(auVar42);
  auVar42 = vshufps_avx(auVar54,auVar54,0x55);
  in_ZMM10 = ZEXT1664(auVar42);
  auVar42 = vshufps_avx(auVar70,auVar70,0x55);
  auVar81 = ZEXT1664(auVar42);
  auVar42 = vxorps_avx512vl(auVar42,auVar40);
  in_ZMM11 = ZEXT1664(auVar42);
  auVar42 = vshufps_avx(auVar54,auVar54,0xaa);
  in_ZMM12 = ZEXT1664(auVar42);
  auVar42 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar42 = vxorps_avx512vl(auVar42,auVar40);
  auVar82 = ZEXT1664(auVar42);
  local_f88 = auVar58._0_4_;
  fStack_f84 = auVar58._0_4_;
  fStack_f80 = auVar58._0_4_;
  fStack_f7c = auVar58._0_4_;
  auVar65._4_4_ = auVar73._0_4_;
  auVar65._0_4_ = auVar73._0_4_;
  auVar65._8_4_ = auVar73._0_4_;
  auVar65._12_4_ = auVar73._0_4_;
  local_f98 = vxorps_avx512vl(auVar65,auVar40);
  local_fa8 = vshufps_avx(auVar58,auVar58,0x55);
  uVar76 = auVar56._0_4_;
  auVar66._4_4_ = uVar76;
  auVar66._0_4_ = uVar76;
  auVar66._8_4_ = uVar76;
  auVar66._12_4_ = uVar76;
  auVar42 = vshufps_avx(auVar56,auVar56,0xaa);
  local_fb8 = vminps_avx(auVar42,auVar66);
  uVar76 = auVar57._0_4_;
  auVar67._4_4_ = uVar76;
  auVar67._0_4_ = uVar76;
  auVar67._8_4_ = uVar76;
  auVar67._12_4_ = uVar76;
  auVar42 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar72 = ZEXT1664(auVar42);
  local_fc8 = vmaxps_avx(auVar42,auVar67);
  auVar42 = vshufps_avx(auVar73,auVar73,0x55);
  local_fd8 = vxorps_avx512vl(auVar42,auVar40);
  auVar69 = ZEXT1664(local_fd8);
  local_fe8 = vshufps_avx(auVar58,auVar58,0xaa);
  auVar42 = vshufps_avx(auVar73,auVar73,0xaa);
  local_ff8 = vxorps_avx512vl(auVar42,auVar40);
LAB_007913f6:
  auVar42 = auVar86._0_16_;
  if (pSVar20 != stack) {
    pSVar28 = pSVar20 + -1;
    uVar32 = ~uVar27 & pSVar20[-1].mask;
    if (uVar32 != 0) {
      sVar23 = (pSVar28->ptr).ptr;
      do {
        auVar62 = in_ZMM30._0_16_;
        if ((sVar23 & 8) != 0) {
          if (uVar32 != 0) {
            auVar40 = vmovdqa64_avx512vl(in_ZMM31._0_16_);
            uVar32 = (ulong)((uint)sVar23 & 0xf);
            valid0.v = ~(byte)uVar27 & 0xf;
            if (uVar32 == 8) goto LAB_007916a2;
            prim = (Primitive_conflict4 *)(sVar23 & 0xfffffffffffffff0);
            local_1170 = 1;
            goto LAB_00791656;
          }
          break;
        }
        auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar23 + 0x20),in_ZMM9._0_16_,
                                  in_ZMM8._0_16_);
        auVar53 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar23 + 0x40),in_ZMM11._0_16_,
                                  in_ZMM10._0_16_);
        auVar40 = vpmaxsd_avx(auVar40,auVar53);
        auVar53 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar23 + 0x60),auVar82._0_16_,
                                  in_ZMM12._0_16_);
        auVar53 = vpmaxsd_avx(auVar53,local_fb8);
        auVar40 = vpmaxsd_avx(auVar40,auVar53);
        auVar17._4_4_ = fStack_f84;
        auVar17._0_4_ = local_f88;
        auVar17._8_4_ = fStack_f80;
        auVar17._12_4_ = fStack_f7c;
        auVar53 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar23 + 0x30),local_f98,auVar17);
        auVar59 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar23 + 0x50),local_fd8,local_fa8);
        auVar53 = vpminsd_avx(auVar53,auVar59);
        auVar60 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar23 + 0x70),local_ff8,local_fe8);
        auVar59 = vpminsd_avx(auVar60,local_fc8);
        auVar53 = vpminsd_avx(auVar53,auVar59);
        uVar24 = vcmpps_avx512vl(auVar40,auVar53,2);
        if ((char)uVar24 == '\0') {
          bVar29 = false;
        }
        else {
          uVar18 = 0;
          sVar21 = 8;
          do {
            lVar16 = 0;
            for (uVar32 = uVar24; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar76 = *(undefined4 *)(sVar23 + 0x20 + lVar16 * 4);
            auVar64._4_4_ = uVar76;
            auVar64._0_4_ = uVar76;
            auVar64._8_4_ = uVar76;
            auVar64._12_4_ = uVar76;
            auVar56 = vfmadd132ps_avx512vl(auVar64,auVar39,auVar36);
            uVar76 = *(undefined4 *)(sVar23 + 0x40 + lVar16 * 4);
            auVar68._4_4_ = uVar76;
            auVar68._0_4_ = uVar76;
            auVar68._8_4_ = uVar76;
            auVar68._12_4_ = uVar76;
            auVar55 = vfmadd132ps_avx512vl(auVar68,auVar33,auVar34);
            uVar76 = *(undefined4 *)(sVar23 + 0x60 + lVar16 * 4);
            auVar71._4_4_ = uVar76;
            auVar71._0_4_ = uVar76;
            auVar71._8_4_ = uVar76;
            auVar71._12_4_ = uVar76;
            auVar59 = vfmadd132ps_avx512vl(auVar71,auVar41,auVar35);
            uVar76 = *(undefined4 *)(sVar23 + 0x30 + lVar16 * 4);
            auVar74._4_4_ = uVar76;
            auVar74._0_4_ = uVar76;
            auVar74._8_4_ = uVar76;
            auVar74._12_4_ = uVar76;
            auVar60 = vfmadd132ps_avx512vl(auVar74,auVar39,auVar36);
            uVar76 = *(undefined4 *)(sVar23 + 0x50 + lVar16 * 4);
            auVar77._4_4_ = uVar76;
            auVar77._0_4_ = uVar76;
            auVar77._8_4_ = uVar76;
            auVar77._12_4_ = uVar76;
            auVar57 = vfmadd132ps_avx512vl(auVar77,auVar33,auVar34);
            auVar78 = ZEXT1664(auVar57);
            uVar76 = *(undefined4 *)(sVar23 + 0x70 + lVar16 * 4);
            auVar80._4_4_ = uVar76;
            auVar80._0_4_ = uVar76;
            auVar80._8_4_ = uVar76;
            auVar80._12_4_ = uVar76;
            auVar61 = vfmadd132ps_avx512vl(auVar80,auVar41,auVar35);
            auVar81 = ZEXT1664(auVar61);
            auVar40 = vpminsd_avx(auVar56,auVar60);
            auVar53 = vpminsd_avx(auVar55,auVar57);
            auVar40 = vpmaxsd_avx(auVar40,auVar53);
            auVar53 = vpminsd_avx(auVar59,auVar61);
            auVar53 = vpmaxsd_avx512vl(auVar53,in_ZMM31._0_16_);
            in_ZMM7 = ZEXT1664(auVar53);
            auVar40 = vpmaxsd_avx(auVar40,auVar53);
            in_ZMM6 = ZEXT1664(auVar40);
            auVar53 = vpmaxsd_avx(auVar56,auVar60);
            auVar56 = vpmaxsd_avx(auVar55,auVar57);
            auVar56 = vpminsd_avx(auVar53,auVar56);
            auVar53 = vpmaxsd_avx(auVar59,auVar61);
            auVar53 = vpminsd_avx512vl(auVar53,auVar62);
            auVar56 = vpminsd_avx(auVar56,auVar53);
            uVar30 = vpcmpd_avx512vl(auVar40,auVar56,2);
            uVar30 = uVar30 & 0xf;
            uVar32 = uVar18;
            sVar22 = sVar21;
            if (((char)uVar30 != '\0') &&
               (sVar22 = *(size_t *)(sVar23 + lVar16 * 8), uVar32 = uVar30, sVar21 != 8)) {
              (pSVar28->ptr).ptr = sVar21;
              pSVar28->mask = uVar18;
              pSVar28 = pSVar28 + 1;
            }
            uVar24 = uVar24 - 1 & uVar24;
            uVar18 = uVar32;
            sVar21 = sVar22;
          } while (uVar24 != 0);
          bVar29 = sVar22 != 8;
          sVar23 = sVar22;
        }
        auVar75 = ZEXT1664(auVar60);
        auVar72 = ZEXT1664(auVar59);
        auVar69 = ZEXT1664(auVar53);
      } while (bVar29);
    }
    bVar29 = false;
    pSVar20 = pSVar28;
    goto LAB_007917bf;
  }
  goto LAB_00791878;
  while( true ) {
    prim = prim + 1;
    bVar29 = uVar32 - 8 <= local_1170;
    local_1170 = local_1170 + 1;
    if (bVar29) break;
LAB_00791656:
    InstanceArrayIntersectorK<4>::occluded(&local_118e,&valid0,&pre,ray,context,prim);
    auVar42 = auVar86._0_16_;
    valid0.v = ~(byte)local_118e & valid0.v & 0xf;
    if (valid0.v == 0) break;
  }
LAB_007916a2:
  bVar25 = (byte)uVar27 | ~valid0.v & 0xf;
  uVar27 = (ulong)bVar25;
  bVar19 = (byte)local_118c & ~bVar25;
  local_118c = (uint)bVar19;
  bVar29 = bVar19 == 0;
  if (bVar29) {
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar53 = vxorps_avx512vl(auVar42,auVar42);
    auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
  }
  else {
    local_1018 = in_ZMM30._0_4_;
    iStack_1014 = in_ZMM30._4_4_;
    iStack_1010 = in_ZMM30._8_4_;
    iStack_100c = in_ZMM30._12_4_;
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    auVar62._0_4_ = (uint)(bVar25 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar25 & 1) * local_1018;
    bVar10 = (bool)(bVar25 >> 1 & 1);
    auVar62._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * iStack_1014;
    bVar10 = (bool)(bVar25 >> 2 & 1);
    auVar62._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * iStack_1010;
    auVar62._12_4_ = (uint)(bVar25 >> 3) * auVar53._12_4_ | (uint)!(bool)(bVar25 >> 3) * iStack_100c
    ;
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar53 = vxorps_avx512vl(auVar42,auVar42);
    auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
  }
  in_ZMM30 = ZEXT1664(auVar62);
  auVar87 = ZEXT1664(auVar42);
  auVar86 = ZEXT1664(auVar53);
  auVar85 = ZEXT1664(auVar59);
  auVar84 = ZEXT1664(auVar60);
  auVar83 = ZEXT1664(auVar56);
  auVar42 = vmovdqa64_avx512vl(auVar40);
  in_ZMM31 = ZEXT1664(auVar42);
  in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
  in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
  auVar82 = ZEXT1664(auVar82._0_16_);
  pSVar20 = pSVar28;
LAB_007917bf:
  if (bVar29) goto LAB_00791878;
  goto LAB_007913f6;
LAB_00791878:
  if (uVar31 == 0) {
    bVar26 = (byte)uVar27 & bVar26;
    bVar29 = (bool)(bVar26 >> 1 & 1);
    bVar10 = (bool)(bVar26 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar26 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar26 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar29 * auVar84._4_4_ | (uint)!bVar29 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar26 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar26 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_007910e9;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }